

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_param.c
# Opt level: O0

int condEvent(void *ptr,mpt_event *ev)

{
  mpt_message *pmVar1;
  int iVar2;
  iovec *piVar3;
  mpt_value *extraout_RDX;
  mpt_value *extraout_RDX_00;
  mpt_value *pmVar4;
  mpt_path *pmVar5;
  int local_54;
  undefined1 auStack_50 [4];
  int ret;
  mpt_message tmp;
  mpt_config *cfg;
  mpt_metatype *conf;
  mpt_event *ev_local;
  void *ptr_local;
  
  if (ev == (mpt_event *)0x0) {
    if (ptr != (void *)0x0) {
      (**(code **)(*ptr + 8))(ptr);
    }
    ptr_local._4_4_ = 0;
  }
  else if (ev->msg == (mpt_message *)0x0) {
    mpt_context_reply(ev->reply,-2,"%s","no default config assign");
    ev->id = 0;
    ptr_local._4_4_ = 3;
  }
  else {
    pmVar1 = ev->msg;
    _auStack_50 = pmVar1->used;
    tmp.used = (size_t)pmVar1->base;
    piVar3 = pmVar1->cont;
    tmp.cont = (iovec *)pmVar1->clen;
    tmp.base = piVar3;
    ptr_local._4_4_ = getArg((mpt_message *)auStack_50,7,"mpt_dispatch_param.cond");
    if (-1 < (int)ptr_local._4_4_) {
      cfg = (mpt_config *)ptr;
      if ((ptr == (void *)0x0) &&
         (cfg = (mpt_config *)mpt_config_global((mpt_path *)0x0),
         (mpt_metatype *)cfg == (mpt_metatype *)0x0)) {
        mpt_context_reply(ev->reply,-2,"%s","no global config");
        ev->id = 0;
        ptr_local._4_4_ = 3;
      }
      else {
        tmp.clen = 0;
        pmVar5 = (mpt_path *)0x85;
        iVar2 = (*cfg->_vptr->query)(cfg,(mpt_path *)0x85,(mpt_config_handler_t *)&tmp.clen,piVar3);
        if ((iVar2 < 0) || (tmp.clen == 0)) {
          local_54 = -4;
          pmVar4 = extraout_RDX;
        }
        else {
          pmVar5 = (mpt_path *)(ulong)ptr_local._4_4_;
          local_54 = mpt_message_assign((mpt_message *)auStack_50,ptr_local._4_4_,condConfig,
                                        (void *)tmp.clen);
          pmVar4 = extraout_RDX_00;
        }
        if (ptr == (void *)0x0) {
          (*cfg->_vptr->assign)(cfg,pmVar5,pmVar4);
        }
        if (local_54 < 0) {
          mpt_context_reply(ev->reply,local_54,"%s","failed to set global config");
          ev->id = 0;
          ptr_local._4_4_ = 3;
        }
        else if (local_54 == 0) {
          mpt_context_reply(ev->reply,0,"%s","keep config element");
          ptr_local._4_4_ = 0;
        }
        else {
          mpt_context_reply(ev->reply,0,"%s","assigned config element");
          ptr_local._4_4_ = 0;
        }
      }
    }
  }
  return ptr_local._4_4_;
}

Assistant:

static int condEvent(void *ptr, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt_dispatch_param.cond";
	MPT_INTERFACE(metatype) *conf = ptr;
	MPT_INTERFACE(config) *cfg;
	MPT_STRUCT(message) tmp;
	int ret;
	
	if (!ev) {
		if (conf) {
			conf->_vptr->unref(conf);
		}
		return 0;
	}
	if (!ev->msg) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no default config assign"));
	}
	tmp = *ev->msg;
	if ((ret = getArg(&tmp, MPT_MESGTYPE(ParamCond), _func)) < 0) {
		return ret;
	}
	/* fallback to global config */
	if (!conf
	    && !(conf = mpt_config_global(0))) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no global config"));
	}
	/* require valid config for replace */
	cfg = 0;
	if (MPT_metatype_convert(conf, MPT_ENUM(TypeConfigPtr), &cfg) < 0
	    || !cfg) {
		ret = MPT_ERROR(BadOperation);
	} else {
		ret = mpt_message_assign(&tmp, ret, condConfig, cfg);
	}
	/* unref global config */
	if (!ptr) {
		conf->_vptr->unref(conf);
	}
	if (ret < 0) {
		return MPT_event_fail(ev, ret, MPT_tr("failed to set global config"));
	}
	if (!ret) {
		return MPT_event_good(ev, MPT_tr("keep config element"));
	}
	return MPT_event_good(ev, MPT_tr("assigned config element"));
}